

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O1

void selection_handles_repeat_new_proc(Am_Object *command_obj,Am_Value *new_sel,Am_Value param_3)

{
  bool bVar1;
  Am_Which_Sel_Direction dir;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  ostream *poVar4;
  Am_Object widget;
  Am_Value_List new_list;
  Am_Object inter;
  Am_Object local_b0;
  Am_String local_a8;
  Am_String local_a0;
  Am_Value old_value;
  Am_Value local_88;
  Am_Value local_78;
  Am_Value local_68;
  Am_Value local_58;
  Am_Value local_48;
  Am_Value local_38;
  
  pAVar2 = Am_Object::Get(command_obj,0xef,3);
  dir = Am_Value::operator_cast_to_int(pAVar2);
  pAVar2 = Am_Object::Get(command_obj,0x1a0,3);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
  pAVar2 = Am_Object::Get(command_obj,0x170,0);
  Am_Object::Am_Object(&inter,pAVar2);
  Am_Object::Get_Object(&widget,(Am_Slot_Key)&inter,10);
  pAVar2 = Am_Object::Get(&widget,0x169,0);
  Am_Value::Am_Value(&old_value,pAVar2);
  if (dir == Am_Sel_NONE) {
    bVar1 = Am_Value::Valid(new_sel);
    if (bVar1) {
      Am_Value_List::Am_Value_List(&new_list);
      bVar1 = Am_Value_List::Test(new_sel);
      if (bVar1) {
        Am_Value_List::operator=(&new_list,new_sel);
      }
      else {
        if (new_sel->type != 0xa001) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"** Amulet_Error: ",0x11);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"New value for selection_handles_repeat_new not list ",
                     0x34);
          poVar4 = operator<<((ostream *)&std::cerr,new_sel);
          std::endl<char,std::char_traits<char>>(poVar4);
          Am_Error();
        }
        Am_Value_List::Add(&new_list,new_sel,Am_TAIL,true);
      }
      pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(&new_list);
      Am_Object::Set(&widget,0x169,pAVar3,0);
      pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(&new_list);
      Am_Value::operator=(new_sel,pAVar3);
      Am_Value::Am_Value(&local_38,new_sel);
      Am_Value::Am_Value(&local_48,new_sel);
      Am_Value::Am_Value(&local_58,&old_value);
      Am_String::Am_String(&local_a0,&Am_No_String);
      set_commands_for_sel
                (command_obj,&inter,&widget,&local_38,&local_48,&local_58,false,
                 (Am_String_Data *)&local_a0,Am_Sel_NONE,false);
      Am_String::~Am_String(&local_a0);
      Am_Value::~Am_Value(&local_58);
      Am_Value::~Am_Value(&local_48);
      Am_Value::~Am_Value(&local_38);
      Am_Value_List::~Am_Value_List(&new_list);
    }
    else {
      pAVar2 = Am_Object::Get(command_obj,0x169,0);
      Am_Value::Am_Value((Am_Value *)&new_list,pAVar2);
      Am_Object::Set(&widget,0x169,(Am_Value *)&new_list,0);
      Am_Value::Am_Value(&local_68,(Am_Value *)&new_list);
      Am_Value::Am_Value(&local_78,(Am_Value *)&new_list);
      Am_Value::Am_Value(&local_88,&old_value);
      Am_String::Am_String(&local_a8,&Am_No_String);
      set_commands_for_sel
                (command_obj,&inter,&widget,&local_68,&local_78,&local_88,false,
                 (Am_String_Data *)&local_a8,Am_Sel_NONE,false);
      Am_String::~Am_String(&local_a8);
      Am_Value::~Am_Value(&local_88);
      Am_Value::~Am_Value(&local_78);
      Am_Value::~Am_Value(&local_68);
      Am_Value::~Am_Value((Am_Value *)&new_list);
    }
  }
  else {
    Am_Object::Am_Object(&local_b0,command_obj);
    do_move_forward_back(&inter,&widget,dir,bVar1,&local_b0);
    Am_Object::~Am_Object(&local_b0);
  }
  Am_Value::~Am_Value(&old_value);
  Am_Object::~Am_Object(&widget);
  Am_Object::~Am_Object(&inter);
  return;
}

Assistant:

Am_Define_Method(Am_Selective_Repeat_New_Method, void,
                 selection_handles_repeat_new,
                 (Am_Object command_obj, Am_Value new_sel,
                  Am_Value /* new_value */))
{
  Am_Which_Sel_Direction dir = (Am_Which_Sel_Direction)(int)command_obj.Get(
      Am_CURRENT_DIRECTION, Am_RETURN_ZERO_ON_ERROR);
  bool extend = command_obj.Get(Am_MULTI_SELECTIONS, Am_RETURN_ZERO_ON_ERROR);
  Am_Object inter = command_obj.Get(Am_SAVED_OLD_OWNER);
  Am_Object widget = inter.Get_Owner();
  Am_Value old_value = widget.Get(Am_VALUE);
  if (dir != Am_Sel_NONE) {
    do_move_forward_back(inter, widget, dir, extend, command_obj);
  } else if (new_sel.Valid()) {
    Am_INTER_TRACE_PRINT(
        widget, "Selection handle "
                    << widget << " selective repeat; new value = " << new_sel);
    Am_Value_List new_list;
    if (Am_Value_List::Test(new_sel))
      new_list = new_sel;
    else if (new_sel.type == Am_OBJECT)
      new_list.Add(new_sel);
    else
      Am_ERROR("New value for selection_handles_repeat_new not list "
               << new_sel);
    widget.Set(Am_VALUE, new_list);
    new_sel = new_list;
    set_commands_for_sel(command_obj, inter, widget, new_sel, new_sel,
                         old_value, false);
  } else {
    Am_Value new_value = command_obj.Get(Am_VALUE);
    Am_INTER_TRACE_PRINT(widget, "Selection handle "
                                     << widget
                                     << " selective repeat; using old value = "
                                     << new_value);
    widget.Set(Am_VALUE, new_value);
    set_commands_for_sel(command_obj, inter, widget, new_value, new_value,
                         old_value, false);
  }
}